

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSC.h
# Opt level: O2

void __thiscall
chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>::
ContIntLoadConstraint_C
          (ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_> *this
          ,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,double recovery_clamp)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ChContactable_3vars<3,_3,_3> *pCVar4;
  ChContactable_1vars<3> *pCVar5;
  ChSystem *pCVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong index;
  double *pdVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar16 [64];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ChVector<double> v;
  Vector V2_w;
  Vector V1_w;
  Vector Vrel_cplane;
  double local_d8;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_b0;
  undefined1 local_a8 [16];
  double local_98;
  undefined1 local_88 [16];
  double local_78;
  undefined1 local_68 [16];
  double local_58;
  double local_48;
  
  auVar16._8_56_ = in_register_00001248;
  auVar16._0_8_ = recovery_clamp;
  index = (ulong)off_L;
  pCVar4 = (this->
           super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>
           ).objA;
  if (((pCVar4 == (ChContactable_3vars<3,_3,_3> *)0x0) ||
      ((this->
       super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>).
       objB == (ChContactable_1vars<3> *)0x0)) ||
     ((this->restitution == 0.0 && (!NAN(this->restitution))))) {
LAB_00a9dcc5:
    dVar1 = this->compliance;
    if ((dVar1 == 0.0) && (!NAN(dVar1))) {
      if (!do_clamp) {
        dVar1 = (this->
                super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>
                ).norm_dist;
        pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,index)
        ;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = dVar1;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = c;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = *pdVar10;
        auVar11 = vfmadd213sd_fma(auVar14,auVar15,auVar3);
        local_d8 = auVar11._0_8_;
        goto LAB_00a9ddac;
      }
      dVar1 = (this->Nx).super_ChConstraintTwoTuplesContactNall.cohesion;
      auVar9._8_8_ = 0x8000000000000000;
      auVar9._0_8_ = 0x8000000000000000;
      auVar11 = vxorpd_avx512vl(auVar16._0_16_,auVar9);
      auVar20._8_8_ = 0;
      auVar20._0_8_ =
           c * (this->
               super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>
               ).norm_dist;
      auVar11 = vmaxsd_avx(auVar20,auVar11);
      local_d8 = auVar11._0_8_;
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        auVar11 = vminsd_avx(ZEXT816(0) << 0x40,auVar11);
        local_d8 = auVar11._0_8_;
      }
      goto LAB_00a9dd9e;
    }
    dVar7 = 1.0 / c + this->dampingf;
    dVar17 = 1.0 / ((1.0 / c) * dVar7);
    (this->Nx).
    super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
    .super_ChConstraint.cfm_i = dVar1 * dVar17;
    dVar17 = dVar17 * this->complianceT;
    (this->Tu).
    super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
    .super_ChConstraint.cfm_i = dVar17;
    (this->Tv).
    super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_1vars<3>_>
    .super_ChConstraint.cfm_i = dVar17;
    auVar8._8_8_ = 0x8000000000000000;
    auVar8._0_8_ = 0x8000000000000000;
    auVar11 = vxorpd_avx512vl(auVar16._0_16_,auVar8);
    dVar1 = (1.0 / dVar7) *
            (this->
            super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>
            ).norm_dist;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar1;
    auVar11 = vmaxsd_avx(auVar19,auVar11);
    local_d8 = (double)((ulong)do_clamp * auVar11._0_8_ + (ulong)!do_clamp * (long)dVar1);
    pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,index);
  }
  else {
    (*(pCVar4->super_ChContactable)._vptr_ChContactable[10])
              (local_68,pCVar4,
               &(this->
                super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>
                ).p1);
    pCVar5 = (this->
             super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>
             ).objB;
    (*(pCVar5->super_ChContactable)._vptr_ChContactable[10])
              (local_88,pCVar5,
               &(this->
                super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>
                ).p2);
    local_b0.m_matrix =
         &(this->
          super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>
          ).contact_plane.super_Matrix<double,_3,_3,_1,_3,_3>;
    local_a8 = vsubpd_avx(local_88,local_68);
    local_98 = local_78 - local_58;
    chrono::operator*(&local_b0,(ChVector<double> *)local_a8);
    local_d8 = local_48 * this->restitution;
    pCVar6 = (((this->
               super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>
               ).container)->super_ChPhysicsItem).system;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = pCVar6->min_bounce_speed;
    auVar11._8_8_ = 0x8000000000000000;
    auVar11._0_8_ = 0x8000000000000000;
    auVar11 = vxorpd_avx512vl(auVar12,auVar11);
    if ((auVar11._0_8_ <= local_d8) ||
       (auVar13._8_8_ = 0, auVar13._0_8_ = pCVar6->step, auVar2._8_8_ = 0,
       auVar2._0_8_ = (this->
                      super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>
                      ).norm_dist, auVar18._8_8_ = 0, auVar18._0_8_ = local_d8,
       auVar11 = vfmadd213sd_fma(auVar13,auVar18,auVar2), 0.0 <= auVar11._0_8_)) goto LAB_00a9dcc5;
LAB_00a9dd9e:
    pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,index);
  }
  local_d8 = local_d8 + *pdVar10;
LAB_00a9ddac:
  *pdVar10 = local_d8;
  return;
}

Assistant:

virtual void ContIntLoadConstraint_C(const unsigned int off_L,  
                                         ChVectorDynamic<>& Qc,     
                                         const double c,            
                                         bool do_clamp,             
                                         double recovery_clamp      
                                         ) override {
        bool bounced = false;

        // Elastic Restitution model (use simple Newton model with coefficient e=v(+)/v(-))
        // Note that this works only if the two connected items are two ChBody.

        if (this->objA && this->objB) {
            if (this->restitution) {
                // compute normal rebounce speed
                Vector V1_w = this->objA->GetContactPointSpeed(this->p1);
                Vector V2_w = this->objB->GetContactPointSpeed(this->p2);
                Vector Vrel_w = V2_w - V1_w;
                Vector Vrel_cplane = this->contact_plane.transpose() * Vrel_w;

                double h = this->container->GetSystem()->GetStep();  // = 1.0 / c;  // not all steppers have c = 1/h

                double neg_rebounce_speed = Vrel_cplane.x() * this->restitution;
                if (neg_rebounce_speed < -this->container->GetSystem()->GetMinBounceSpeed())
                    if (this->norm_dist + neg_rebounce_speed * h < 0) {
                        // CASE: BOUNCE
                        bounced = true;
                        Qc(off_L) += neg_rebounce_speed;
                    }
            }
        }

        if (!bounced) {
            // CASE: SETTLE (most often, and also default if two colliding items are not two ChBody)

            if (this->compliance) {
                double h = 1.0 / c;  // was: this->container->GetSystem()->GetStep(); note not all steppers have c = 1/h

                double alpha = this->dampingf;              // [R]=alpha*[K]
                double inv_hpa = 1.0 / (h + alpha);         // 1/(h+a)
                double inv_hhpa = 1.0 / (h * (h + alpha));  // 1/(h*(h+a))

                //***TODO*** move to KRMmatricesLoad() the following, and only for !bounced case
                Nx.Set_cfm_i((inv_hhpa) * this->compliance);
                Tu.Set_cfm_i((inv_hhpa) * this->complianceT);
                Tv.Set_cfm_i((inv_hhpa) * this->complianceT);

                double qc = inv_hpa * this->norm_dist;  //***TODO*** see how to move this in KRMmatricesLoad()
				
                // Note: clamping of Qc in case of compliance is questionable: it does not limit only the outbound
                // speed, but also the reaction, so it might allow longer 'sinking' not related to the real compliance.
				// I.e. If clamping kicks in (when using large timesteps and low compliance), it acts as a numerical damping.
				if (do_clamp) {
					qc = ChMax(qc, -recovery_clamp);
				}

                Qc(off_L) += qc;

            } else {
                if (do_clamp)
                    if (this->Nx.GetCohesion())
                        Qc(off_L) += ChMin(0.0, ChMax(c * this->norm_dist, -recovery_clamp));
                    else
                        Qc(off_L) += ChMax(c * this->norm_dist, -recovery_clamp);
                else
                    Qc(off_L) += c * this->norm_dist;
            }
        }
    }